

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O0

char * lj_str_pushvf(lua_State *L,char *fmt,__va_list_tag *argp)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  lua_State *in_RDX;
  char *in_RSI;
  long in_RDI;
  ptrdiff_t lasti;
  ptrdiff_t i;
  ptrdiff_t p_1;
  char buf_2 [18];
  MSize len;
  TValue tv;
  char buf_1 [32];
  char *p;
  char buf [11];
  char *s;
  char *e;
  SBuf *sb;
  SBuf *in_stack_fffffffffffffe28;
  cTValue *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  MSize len_00;
  long lVar6;
  char *in_stack_fffffffffffffe40;
  char *str;
  SBuf *in_stack_fffffffffffffe48;
  lua_State *in_stack_fffffffffffffe50;
  undefined4 *puVar7;
  undefined4 in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  ulong *in_stack_fffffffffffffe60;
  lua_State *in_stack_fffffffffffffe68;
  undefined8 *local_188;
  int32_t *local_168;
  long *local_108;
  ulong local_d8;
  undefined8 local_d0;
  undefined1 local_c8;
  undefined1 local_c7;
  undefined4 local_b4;
  undefined8 local_b0;
  char *local_80;
  char local_73 [11];
  char *local_68;
  char *local_60;
  long local_58;
  lua_State *local_50;
  char *local_48;
  long local_40;
  GCstr *local_38;
  undefined4 *local_30;
  undefined4 local_1c;
  GCstr *local_18;
  undefined4 *local_10;
  
  local_58 = (ulong)*(uint *)(in_RDI + 8) + 0x58;
  local_50 = in_RDX;
  local_48 = in_RSI;
  local_40 = in_RDI;
  strlen(in_RSI);
  lj_str_needbuf((lua_State *)&in_stack_fffffffffffffe30->field_2,in_stack_fffffffffffffe28,0);
  *(undefined4 *)(local_58 + 8) = 0;
  while( true ) {
    local_60 = strchr(local_48,0x25);
    if (local_60 == (char *)0x0) break;
    addstr(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
           (MSize)((ulong)in_stack_fffffffffffffe38 >> 0x20));
    cVar1 = local_60[1];
    if (cVar1 == '%') {
      addchar((lua_State *)&in_stack_fffffffffffffe30->field_2,in_stack_fffffffffffffe28,0);
    }
    else if (cVar1 == 'c') {
      uVar2 = (local_50->nextgc).gcptr32;
      if (uVar2 < 0x29) {
        (local_50->nextgc).gcptr32 = uVar2 + 8;
      }
      else {
        *(long *)&local_50->glref = *(long *)&local_50->glref + 8;
      }
      addchar((lua_State *)&in_stack_fffffffffffffe30->field_2,in_stack_fffffffffffffe28,0);
    }
    else if (cVar1 == 'd') {
      uVar2 = (local_50->nextgc).gcptr32;
      if (uVar2 < 0x29) {
        local_168 = (int32_t *)((long)(int)uVar2 + (long)local_50->base);
        (local_50->nextgc).gcptr32 = uVar2 + 8;
      }
      else {
        local_168 = *(int32_t **)&local_50->glref;
        *(int32_t **)&local_50->glref = local_168 + 2;
      }
      local_80 = lj_str_bufint(local_73,*local_168);
      addstr(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
             (MSize)((ulong)in_stack_fffffffffffffe38 >> 0x20));
    }
    else if (cVar1 == 'f') {
      uVar2 = *(uint *)&local_50->marked;
      if (uVar2 < 0xa1) {
        local_188 = (undefined8 *)((long)(int)uVar2 + (long)local_50->base);
        *(uint *)&local_50->marked = uVar2 + 0x10;
      }
      else {
        local_188 = *(undefined8 **)&local_50->glref;
        *(undefined8 **)&local_50->glref = local_188 + 1;
      }
      local_b0 = *local_188;
      sVar4 = lj_str_bufnum(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      local_b4 = (undefined4)sVar4;
      addstr(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
             (MSize)((ulong)in_stack_fffffffffffffe38 >> 0x20));
    }
    else if (cVar1 == 'p') {
      uVar2 = (local_50->nextgc).gcptr32;
      if (uVar2 < 0x29) {
        in_stack_fffffffffffffe60 = (ulong *)((long)(int)uVar2 + (long)local_50->base);
        (local_50->nextgc).gcptr32 = uVar2 + 8;
      }
      else {
        in_stack_fffffffffffffe60 = *(ulong **)&local_50->glref;
        *(ulong **)&local_50->glref = in_stack_fffffffffffffe60 + 1;
      }
      local_d0 = *in_stack_fffffffffffffe60;
      len_00 = (MSize)((ulong)in_stack_fffffffffffffe38 >> 0x20);
      in_stack_fffffffffffffe68 = local_50;
      if (local_d0 == 0) {
        addstr(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,len_00)
        ;
      }
      else {
        if ((long)local_d0 >> 0x20 == 0) {
          in_stack_fffffffffffffe5c = 0;
        }
        else {
          uVar2 = 0x1f;
          uVar3 = (uint)(local_d0 >> 0x20);
          if (uVar3 != 0) {
            for (; uVar3 >> uVar2 == 0; uVar2 = uVar2 - 1) {
            }
          }
          in_stack_fffffffffffffe5c = (uVar2 >> 3) * 2 + 2;
        }
        local_c8 = 0x30;
        local_c7 = 0x78;
        uVar5 = (ulong)(in_stack_fffffffffffffe5c + 10);
        while (local_d8 = uVar5 - 1, 1 < (long)local_d8) {
          *(char *)((long)&local_d0 + uVar5 + 7) = "0123456789abcdef"[local_d0 & 0xf];
          local_d0 = (long)local_d0 >> 4;
          uVar5 = local_d8;
        }
        addstr(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,len_00)
        ;
      }
    }
    else if (cVar1 == 's') {
      uVar2 = (local_50->nextgc).gcptr32;
      if (uVar2 < 0x29) {
        local_108 = (long *)((long)(int)uVar2 + (long)local_50->base);
        (local_50->nextgc).gcptr32 = uVar2 + 8;
      }
      else {
        local_108 = *(long **)&local_50->glref;
        *(long **)&local_50->glref = local_108 + 1;
      }
      local_68 = (char *)*local_108;
      if (local_68 == (char *)0x0) {
        local_68 = "(null)";
      }
      strlen(local_68);
      addstr(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
             (MSize)((ulong)in_stack_fffffffffffffe38 >> 0x20));
    }
    else {
      addchar((lua_State *)&in_stack_fffffffffffffe30->field_2,in_stack_fffffffffffffe28,0);
      addchar((lua_State *)&in_stack_fffffffffffffe30->field_2,in_stack_fffffffffffffe28,0);
    }
    local_48 = local_60 + 2;
  }
  lVar6 = local_58;
  str = local_48;
  strlen(local_48);
  addstr(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,str,(MSize)((ulong)lVar6 >> 0x20));
  puVar7 = *(undefined4 **)(local_40 + 0x18);
  local_38 = lj_str_new(in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60,
                        CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  local_1c = 0xfffffffb;
  *puVar7 = (int)local_38;
  puVar7[1] = 0xfffffffb;
  uVar5 = *(long *)(local_40 + 0x18) + 8;
  *(ulong *)(local_40 + 0x18) = uVar5;
  if (*(uint *)(local_40 + 0x20) <= uVar5) {
    local_30 = puVar7;
    local_18 = local_38;
    local_10 = puVar7;
    lj_state_growstack1((lua_State *)0x10bb46);
  }
  return (char *)((ulong)*(uint *)(*(long *)(local_40 + 0x18) + -8) + 0x10);
}

Assistant:

const char *lj_str_pushvf(lua_State *L, const char *fmt, va_list argp)
{
  SBuf *sb = &G(L)->tmpbuf;
  lj_str_needbuf(L, sb, (MSize)strlen(fmt));
  lj_str_resetbuf(sb);
  for (;;) {
    const char *e = strchr(fmt, '%');
    if (e == NULL) break;
    addstr(L, sb, fmt, (MSize)(e-fmt));
    /* This function only handles %s, %c, %d, %f and %p formats. */
    switch (e[1]) {
    case 's': {
      const char *s = va_arg(argp, char *);
      if (s == NULL) s = "(null)";
      addstr(L, sb, s, (MSize)strlen(s));
      break;
      }
    case 'c':
      addchar(L, sb, va_arg(argp, int));
      break;
    case 'd': {
      char buf[LJ_STR_INTBUF];
      char *p = lj_str_bufint(buf, va_arg(argp, int32_t));
      addstr(L, sb, p, (MSize)(buf+LJ_STR_INTBUF-p));
      break;
      }
    case 'f': {
      char buf[LJ_STR_NUMBUF];
      TValue tv;
      MSize len;
      tv.n = (lua_Number)(va_arg(argp, LUAI_UACNUMBER));
      len = (MSize)lj_str_bufnum(buf, &tv);
      addstr(L, sb, buf, len);
      break;
      }
    case 'p': {
#define FMTP_CHARS	(2*sizeof(ptrdiff_t))
      char buf[2+FMTP_CHARS];
      ptrdiff_t p = (ptrdiff_t)(va_arg(argp, void *));
      ptrdiff_t i, lasti = 2+FMTP_CHARS;
      if (p == 0) {
	addstr(L, sb, "NULL", 4);
	break;
      }
#if LJ_64
      /* Shorten output for 64 bit pointers. */
      lasti = 2+2*4+((p >> 32) ? 2+2*(lj_fls((uint32_t)(p >> 32))>>3) : 0);
#endif
      buf[0] = '0';
      buf[1] = 'x';
      for (i = lasti-1; i >= 2; i--, p >>= 4)
	buf[i] = "0123456789abcdef"[(p & 15)];
      addstr(L, sb, buf, (MSize)lasti);
      break;
      }
    case '%':
      addchar(L, sb, '%');
      break;
    default:
      addchar(L, sb, '%');
      addchar(L, sb, e[1]);
      break;
    }
    fmt = e+2;
  }
  addstr(L, sb, fmt, (MSize)strlen(fmt));
  setstrV(L, L->top, lj_str_new(L, sb->buf, sb->n));
  incr_top(L);
  return strVdata(L->top - 1);
}